

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_tools_visuals.cxx
# Opt level: O0

uint16_t __thiscall
level_tools::find_or_register_mu_model(level_tools *this,xr_ogf_v4 *new_mu,fmatrix *xform)

{
  float fVar1;
  xr_ogf_v4 *this_00;
  xr_ogf *this_01;
  vector<xray_re::xr_ogf_*,_std::allocator<xray_re::xr_ogf_*>_> *pvVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  ogf_model_type oVar6;
  ogf_model_type oVar7;
  uint32_t uVar8;
  uint32_t uVar9;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar10;
  fmatrix *pfVar11;
  reference ppxVar12;
  size_type sVar13;
  reference puVar14;
  const_reference ppxVar15;
  ulong uVar16;
  size_type sVar17;
  xr_ogf_v4 *local_a8;
  xr_ogf_v4 *local_a0;
  xr_ogf_v4 *ogf2;
  xr_ogf_v4 *ogf1;
  const_iterator it2;
  const_iterator end1;
  const_iterator it1;
  xr_ogf *mu;
  __normal_iterator<xray_re::xr_ogf_*const_*,_std::vector<xray_re::xr_ogf_*,_std::allocator<xray_re::xr_ogf_*>_>_>
  local_68;
  xr_ogf_vec_cit end_1;
  __normal_iterator<xray_re::xr_ogf_*const_*,_std::vector<xray_re::xr_ogf_*,_std::allocator<xray_re::xr_ogf_*>_>_>
  local_58;
  xr_ogf_vec_cit it_1;
  uint16_t model_idx;
  xr_ogf_v4 *ogf;
  const_iterator end;
  const_iterator it;
  const_iterator it0;
  fmatrix *xform_local;
  xr_ogf_v4 *new_mu_local;
  level_tools *this_local;
  
  pvVar10 = xray_re::xr_ogf::children_l(&new_mu->super_xr_ogf);
  end = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(pvVar10);
  it._M_current = end._M_current;
  pvVar10 = xray_re::xr_ogf::children_l(&new_mu->super_xr_ogf);
  ogf = (xr_ogf_v4 *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(pvVar10);
  while (bVar3 = __gnu_cxx::operator!=
                           (&end,(__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                  *)&ogf), bVar3) {
    pvVar2 = this->m_subdivisions;
    puVar14 = __gnu_cxx::
              __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
              ::operator*(&end);
    ppxVar15 = std::vector<xray_re::xr_ogf_*,_std::allocator<xray_re::xr_ogf_*>_>::at
                         (pvVar2,(ulong)*puVar14);
    this_00 = (xr_ogf_v4 *)*ppxVar15;
    oVar6 = xray_re::xr_ogf::model_type((xr_ogf *)this_00);
    if ((oVar6 != MT3_SKELETON_GEOMDEF_ST) && (oVar6 != MT3_LOD)) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/utils/converter/level_tools_visuals.cxx"
                    ,0x11e,"uint16_t level_tools::find_or_register_mu_model(xr_ogf_v4 *, fmatrix &)"
                   );
    }
    pfVar11 = xray_re::xr_ogf_v4::xform(this_00);
    xray_re::_matrix<float>::set<float>(xform,pfVar11);
    bVar4 = __gnu_cxx::operator==(&end,&it);
    bVar3 = true;
    if (!bVar4) {
      pfVar11 = xray_re::xr_ogf_v4::xform(this_00);
      iVar5 = memcmp(pfVar11,xform,0x40);
      bVar3 = iVar5 == 0;
    }
    if (!bVar3) {
      __assert_fail("it == it0 || std::memcmp(&ogf->xform(), &xform, sizeof(xform)) == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/utils/converter/level_tools_visuals.cxx"
                    ,0x11a,"uint16_t level_tools::find_or_register_mu_model(xr_ogf_v4 *, fmatrix &)"
                   );
    }
    fVar1 = (xform->field_0).field_0._14;
    bVar3 = false;
    if ((fVar1 == 0.0) && (!NAN(fVar1))) {
      fVar1 = (xform->field_0).field_0._24;
      bVar3 = false;
      if ((fVar1 == 0.0) && (!NAN(fVar1))) {
        bVar3 = (xform->field_0).field_0._34 == 0.0;
      }
    }
    if (!bVar3) {
      __assert_fail("xform._14 == 0 && xform._24 == 0 && xform._34 == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/utils/converter/level_tools_visuals.cxx"
                    ,0x11b,"uint16_t level_tools::find_or_register_mu_model(xr_ogf_v4 *, fmatrix &)"
                   );
    }
    __gnu_cxx::
    __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
    ::operator++(&end);
  }
  it_1._M_current._6_2_ = 0;
  end_1._M_current =
       (xr_ogf **)
       std::vector<xray_re::xr_ogf_*,_std::allocator<xray_re::xr_ogf_*>_>::begin(&this->m_mu_models)
  ;
  __gnu_cxx::
  __normal_iterator<xray_re::xr_ogf*const*,std::vector<xray_re::xr_ogf*,std::allocator<xray_re::xr_ogf*>>>
  ::__normal_iterator<xray_re::xr_ogf**>
            ((__normal_iterator<xray_re::xr_ogf*const*,std::vector<xray_re::xr_ogf*,std::allocator<xray_re::xr_ogf*>>>
              *)&local_58,
             (__normal_iterator<xray_re::xr_ogf_**,_std::vector<xray_re::xr_ogf_*,_std::allocator<xray_re::xr_ogf_*>_>_>
              *)&end_1);
  mu = (xr_ogf *)
       std::vector<xray_re::xr_ogf_*,_std::allocator<xray_re::xr_ogf_*>_>::end(&this->m_mu_models);
  __gnu_cxx::
  __normal_iterator<xray_re::xr_ogf*const*,std::vector<xray_re::xr_ogf*,std::allocator<xray_re::xr_ogf*>>>
  ::__normal_iterator<xray_re::xr_ogf**>
            ((__normal_iterator<xray_re::xr_ogf*const*,std::vector<xray_re::xr_ogf*,std::allocator<xray_re::xr_ogf*>>>
              *)&local_68,
             (__normal_iterator<xray_re::xr_ogf_**,_std::vector<xray_re::xr_ogf_*,_std::allocator<xray_re::xr_ogf_*>_>_>
              *)&mu);
  do {
    bVar3 = __gnu_cxx::operator!=(&local_58,&local_68);
    if (!bVar3) {
      uVar16 = (ulong)it_1._M_current._6_2_;
      sVar17 = std::vector<xray_re::xr_ogf_*,_std::allocator<xray_re::xr_ogf_*>_>::size
                         (&this->m_mu_models);
      if (uVar16 == sVar17) {
        local_a8 = new_mu;
        std::vector<xray_re::xr_ogf_*,_std::allocator<xray_re::xr_ogf_*>_>::push_back
                  (&this->m_mu_models,(value_type *)&local_a8);
        return it_1._M_current._6_2_;
      }
      __assert_fail("model_idx == m_mu_models.size()",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/utils/converter/level_tools_visuals.cxx"
                    ,0x143,"uint16_t level_tools::find_or_register_mu_model(xr_ogf_v4 *, fmatrix &)"
                   );
    }
    ppxVar12 = __gnu_cxx::
               __normal_iterator<xray_re::xr_ogf_*const_*,_std::vector<xray_re::xr_ogf_*,_std::allocator<xray_re::xr_ogf_*>_>_>
               ::operator*(&local_58);
    this_01 = *ppxVar12;
    pvVar10 = xray_re::xr_ogf::children_l(this_01);
    sVar17 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(pvVar10);
    pvVar10 = xray_re::xr_ogf::children_l(&new_mu->super_xr_ogf);
    sVar13 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(pvVar10);
    if (sVar17 == sVar13) {
      pvVar10 = xray_re::xr_ogf::children_l(this_01);
      end1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(pvVar10);
      pvVar10 = xray_re::xr_ogf::children_l(this_01);
      it2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(pvVar10);
      pvVar10 = xray_re::xr_ogf::children_l(&new_mu->super_xr_ogf);
      ogf1 = (xr_ogf_v4 *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(pvVar10);
      while( true ) {
        bVar3 = __gnu_cxx::operator!=(&end1,&it2);
        if (!bVar3) {
          return it_1._M_current._6_2_;
        }
        pvVar2 = this->m_subdivisions;
        puVar14 = __gnu_cxx::
                  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                  ::operator*(&end1);
        ppxVar15 = std::vector<xray_re::xr_ogf_*,_std::allocator<xray_re::xr_ogf_*>_>::at
                             (pvVar2,(ulong)*puVar14);
        ogf2 = (xr_ogf_v4 *)*ppxVar15;
        pvVar2 = this->m_subdivisions;
        puVar14 = __gnu_cxx::
                  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                  ::operator*((__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                               *)&ogf1);
        ppxVar15 = std::vector<xray_re::xr_ogf_*,_std::allocator<xray_re::xr_ogf_*>_>::at
                             (pvVar2,(ulong)*puVar14);
        local_a0 = (xr_ogf_v4 *)*ppxVar15;
        oVar6 = xray_re::xr_ogf::model_type(&ogf2->super_xr_ogf);
        oVar7 = xray_re::xr_ogf::model_type(&local_a0->super_xr_ogf);
        if (oVar6 != oVar7) break;
        uVar8 = xray_re::xr_ogf_v4::ext_vb_index(ogf2);
        uVar9 = xray_re::xr_ogf_v4::ext_vb_index(local_a0);
        if (uVar8 != uVar9) break;
        uVar8 = xray_re::xr_ogf_v4::ext_vb_offset(ogf2);
        uVar9 = xray_re::xr_ogf_v4::ext_vb_offset(local_a0);
        if (uVar8 != uVar9) break;
        uVar8 = xray_re::xr_ogf_v4::ext_vb_size(ogf2);
        uVar9 = xray_re::xr_ogf_v4::ext_vb_size(local_a0);
        if (uVar8 != uVar9) break;
        uVar8 = xray_re::xr_ogf_v4::ext_ib_index(ogf2);
        uVar9 = xray_re::xr_ogf_v4::ext_ib_index(local_a0);
        if (uVar8 != uVar9) break;
        uVar8 = xray_re::xr_ogf_v4::ext_ib_offset(ogf2);
        uVar9 = xray_re::xr_ogf_v4::ext_ib_offset(local_a0);
        if (uVar8 != uVar9) break;
        uVar8 = xray_re::xr_ogf_v4::ext_ib_size(ogf2);
        uVar9 = xray_re::xr_ogf_v4::ext_ib_size(local_a0);
        if (uVar8 != uVar9) break;
        __gnu_cxx::
        __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
        ::operator++(&end1);
        __gnu_cxx::
        __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
        ::operator++((__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                      *)&ogf1);
      }
    }
    __gnu_cxx::
    __normal_iterator<xray_re::xr_ogf_*const_*,_std::vector<xray_re::xr_ogf_*,_std::allocator<xray_re::xr_ogf_*>_>_>
    ::operator++(&local_58);
    it_1._M_current._6_2_ = it_1._M_current._6_2_ + 1;
  } while( true );
}

Assistant:

uint16_t level_tools::find_or_register_mu_model(xr_ogf_v4* new_mu, fmatrix& xform)
{
	for (std::vector<uint32_t>::const_iterator it0 = new_mu->children_l().begin(),
			it = it0, end = new_mu->children_l().end(); it != end; ++it) {
		const xr_ogf_v4* ogf = static_cast<const xr_ogf_v4*>(m_subdivisions->at(*it));
		switch (ogf->model_type()) {
		case MT4_TREE_ST:
		case MT4_TREE_PM:
			xform.set(ogf->xform());
			xr_assert(it == it0 || std::memcmp(&ogf->xform(), &xform, sizeof(xform)) == 0);
			xr_assert(xform._14 == 0 && xform._24 == 0 && xform._34 == 0);
			break;
		default:
			xr_not_expected();
			break;
		}
	}

	uint16_t model_idx = 0;
	for (xr_ogf_vec_cit it = m_mu_models.begin(), end = m_mu_models.end();
			it != end; ++it, ++model_idx) {
		const xr_ogf* mu = *it;
		if (mu->children_l().size() != new_mu->children_l().size())
			continue;
		// FIXME: sort children for robustness
		for (std::vector<uint32_t>::const_iterator it1 = mu->children_l().begin(),
				end1 = mu->children_l().end(), it2 = new_mu->children_l().begin();
				it1 != end1; ++it1, ++it2) {
			const xr_ogf_v4* ogf1 = static_cast<const xr_ogf_v4*>(m_subdivisions->at(*it1));
			const xr_ogf_v4* ogf2 = static_cast<const xr_ogf_v4*>(m_subdivisions->at(*it2));
			if (ogf1->model_type() != ogf2->model_type())
				goto skip;
			// FIXME: though it is reasonably to assume MU-models always reference
			// external VB/IB, better have some explicit check here.
			if (ogf1->ext_vb_index() != ogf2->ext_vb_index())
				goto skip;
			if (ogf1->ext_vb_offset() != ogf2->ext_vb_offset())
				goto skip;
			if (ogf1->ext_vb_size() != ogf2->ext_vb_size())
				goto skip;
			if (ogf1->ext_ib_index() != ogf2->ext_ib_index())
				goto skip;
			if (ogf1->ext_ib_offset() != ogf2->ext_ib_offset())
				goto skip;
			if (ogf1->ext_ib_size() != ogf2->ext_ib_size())
				goto skip;
		}
		return model_idx;
skip:;
	}
	xr_assert(model_idx == m_mu_models.size());
	m_mu_models.push_back(new_mu);
	return model_idx;
}